

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

void __thiscall helics::apps::Tracer::loadCaptureInterfaces(Tracer *this)

{
  pointer pbVar1;
  element_type *peVar2;
  pointer pbVar3;
  bool bVar4;
  pointer pcVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pub;
  pointer pbVar6;
  helics *this_00;
  milliseconds in_R8;
  pointer pbVar7;
  string_view key;
  string_view fedName;
  string_view target;
  string_view target_00;
  string_view queryres;
  string_view queryStr;
  string_view queryStr_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pubs;
  string local_70;
  string local_50;
  
  pbVar1 = (this->captureInterfaces).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (this->captureInterfaces).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar1; pbVar7 = pbVar7 + 1) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      this_00 = (helics *)0x0;
    }
    else {
      this_00 = (helics *)
                ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]);
    }
    fedName._M_str = (char *)0x2710;
    fedName._M_len = (size_t)(pbVar7->_M_dataplus)._M_p;
    bVar4 = waitForInit(this_00,(Federate *)pbVar7->_M_string_length,fedName,in_R8);
    if (bVar4) {
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      in_R8.__r = 0xc;
      target._M_str = "root";
      target._M_len = 4;
      queryStr._M_str = "global_flush";
      queryStr._M_len = 0xc;
      Federate::query_abi_cxx11_
                (&local_50,
                 (Federate *)
                 ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                 (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),target,queryStr,
                 HELICS_SEQUENCING_MODE_ORDERED);
      std::__cxx11::string::~string((string *)&local_50);
      peVar2 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      pcVar5 = (pbVar7->_M_dataplus)._M_p;
      target_00._M_str = pcVar5;
      target_00._M_len = pbVar7->_M_string_length;
      queryStr_00._M_str = "publications";
      queryStr_00._M_len = 0xc;
      Federate::query_abi_cxx11_
                (&local_70,
                 (Federate *)
                 ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                 (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]),target_00,queryStr_00,
                 HELICS_SEQUENCING_MODE_ORDERED);
      queryres._M_str = pcVar5;
      queryres._M_len = (size_t)local_70._M_dataplus._M_p;
      vectorizeQueryResult_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&pubs,(helics *)local_70._M_string_length,queryres);
      std::__cxx11::string::~string((string *)&local_70);
      pbVar3 = pubs.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = pubs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar3; pbVar6 = pbVar6 + 1
          ) {
        key._M_str = (pbVar6->_M_dataplus)._M_p;
        key._M_len = pbVar6->_M_string_length;
        addSubscription(this,key);
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&pubs);
    }
  }
  return;
}

Assistant:

void Tracer::loadCaptureInterfaces()
{
    for (auto& capt : captureInterfaces) {
        auto res = waitForInit(fed.get(), capt);
        if (res) {
            fed->query("root", "global_flush", HELICS_SEQUENCING_MODE_ORDERED);
            auto pubs = vectorizeQueryResult(
                fed->query(capt, "publications", HELICS_SEQUENCING_MODE_ORDERED));
            for (auto& pub : pubs) {
                addSubscription(pub);
            }
        }
    }
}